

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STPathSet.cpp
# Opt level: O2

Value __thiscall jbcoin::STPath::getJson(STPath *this,int param_1)

{
  undefined8 *puVar1;
  uint uVar2;
  Value *pVVar3;
  long lVar4;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  uint64_t uiHost;
  AccountID *v;
  Currency *extraout_RDX_00;
  AccountID *extraout_RDX_01;
  AccountID *currency;
  undefined8 extraout_RDX_02;
  jbcoin *this_00;
  undefined4 in_register_00000034;
  undefined8 *puVar6;
  STPathElement *pSVar7;
  undefined8 *puVar8;
  byte bVar9;
  Value VVar10;
  Value local_c0;
  string local_b0;
  Value elem;
  STPathElement it;
  
  bVar9 = 0;
  Json::Value::Value((Value *)this,arrayValue);
  puVar1 = (undefined8 *)((undefined8 *)CONCAT44(in_register_00000034,param_1))[1];
  uVar5 = extraout_RDX;
  for (puVar8 = *(undefined8 **)CONCAT44(in_register_00000034,param_1); puVar8 != puVar1;
      puVar8 = puVar8 + 10) {
    puVar6 = puVar8;
    pSVar7 = &it;
    for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
      uVar5 = *puVar6;
      pSVar7->mType = (int)uVar5;
      (pSVar7->mAccountID).pn[0] = (int)((ulong)uVar5 >> 0x20);
      puVar6 = puVar6 + (ulong)bVar9 * -2 + 1;
      pSVar7 = (STPathElement *)((long)pSVar7 + (ulong)bVar9 * -0x10 + 8);
    }
    Json::Value::Value(&elem,objectValue);
    uVar2 = it.mType;
    this_00 = (jbcoin *)(long)(int)it.mType;
    local_b0._M_string_length._0_1_ = 1;
    local_b0._M_dataplus._M_p._0_4_ = it.mType;
    pVVar3 = Json::Value::operator[](&elem,(StaticString *)&jss::type);
    Json::Value::swap(pVVar3,(Value *)&local_b0);
    Json::Value::~Value((Value *)&local_b0);
    strHex_abi_cxx11_(&local_b0,this_00,uiHost);
    Json::Value::Value(&local_c0,&local_b0);
    pVVar3 = Json::Value::operator[](&elem,(StaticString *)&jss::type_hex);
    Json::Value::swap(pVVar3,&local_c0);
    Json::Value::~Value(&local_c0);
    std::__cxx11::string::~string((string *)&local_b0);
    currency = v;
    if (((ulong)this_00 & 1) != 0) {
      toBase58_abi_cxx11_(&local_b0,(jbcoin *)&it.mAccountID,v);
      Json::Value::Value(&local_c0,&local_b0);
      pVVar3 = Json::Value::operator[](&elem,(StaticString *)&jss::account);
      Json::Value::swap(pVVar3,&local_c0);
      Json::Value::~Value(&local_c0);
      std::__cxx11::string::~string((string *)&local_b0);
      currency = (AccountID *)extraout_RDX_00;
    }
    if ((uVar2 & 0x10) != 0) {
      to_string_abi_cxx11_(&local_b0,(jbcoin *)&it.mCurrencyID,(Currency *)currency);
      Json::Value::Value(&local_c0,&local_b0);
      pVVar3 = Json::Value::operator[](&elem,(StaticString *)&jss::currency);
      Json::Value::swap(pVVar3,&local_c0);
      Json::Value::~Value(&local_c0);
      std::__cxx11::string::~string((string *)&local_b0);
      currency = extraout_RDX_01;
    }
    if ((uVar2 & 0x20) != 0) {
      toBase58_abi_cxx11_(&local_b0,(jbcoin *)&it.mIssuerID,currency);
      Json::Value::Value(&local_c0,&local_b0);
      pVVar3 = Json::Value::operator[](&elem,(StaticString *)&jss::issuer);
      Json::Value::swap(pVVar3,&local_c0);
      Json::Value::~Value(&local_c0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    Json::Value::append((Value *)this,&elem);
    Json::Value::~Value(&elem);
    uVar5 = extraout_RDX_02;
  }
  VVar10._8_8_ = uVar5;
  VVar10.value_.map_ = (ObjectValues *)this;
  return VVar10;
}

Assistant:

Json::Value
STPath::getJson (int) const
{
    Json::Value ret (Json::arrayValue);

    for (auto it: mPath)
    {
        Json::Value elem (Json::objectValue);
        int         iType   = it.getNodeType ();

        elem[jss::type]      = iType;
        elem[jss::type_hex]  = strHex (iType);

        if (iType & STPathElement::typeAccount)
            elem[jss::account]  = to_string (it.getAccountID ());

        if (iType & STPathElement::typeCurrency)
            elem[jss::currency] = to_string (it.getCurrency ());

        if (iType & STPathElement::typeIssuer)
            elem[jss::issuer]   = to_string (it.getIssuerID ());

        ret.append (elem);
    }

    return ret;
}